

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O2

void start_watcher(uv_loop_t *loop,int signum,signal_ctx *ctx,int one_shot)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uv_signal_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  ctx->signum = signum;
  ctx->stop_or_close = CLOSE;
  ctx->ncalls = 0;
  ctx->one_shot = one_shot;
  puVar4 = &ctx->handle;
  iVar1 = uv_signal_init(loop,puVar4);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    if (one_shot == 0) {
      iVar1 = uv_signal_start(puVar4,signal_cb,signum);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        return;
      }
      pcVar3 = "uv_signal_start(&ctx->handle, signal_cb, signum)";
      uVar2 = 0x94;
    }
    else {
      iVar1 = uv_signal_start_oneshot(puVar4,signal_cb_one_shot,signum);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        return;
      }
      pcVar3 = "uv_signal_start_oneshot(&ctx->handle, signal_cb_one_shot, signum)";
      uVar2 = 0x92;
    }
  }
  else {
    pcVar3 = "uv_signal_init(loop, &ctx->handle)";
    uVar2 = 0x90;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
          ,uVar2,pcVar3,"==","0",eval_a,"==",0);
  abort();
}

Assistant:

static void start_watcher(uv_loop_t* loop,
                          int signum,
                          struct signal_ctx* ctx,
                          int one_shot) {
  ctx->ncalls = 0;
  ctx->signum = signum;
  ctx->stop_or_close = CLOSE;
  ctx->one_shot = one_shot;
  ASSERT_OK(uv_signal_init(loop, &ctx->handle));
  if (one_shot)
    ASSERT_OK(uv_signal_start_oneshot(&ctx->handle, signal_cb_one_shot, signum));
  else
    ASSERT_OK(uv_signal_start(&ctx->handle, signal_cb, signum));
}